

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.h
# Opt level: O2

bool __thiscall
flatbuffers::BinaryAnnotator::IsValidUnionValue(BinaryAnnotator *this,Field *field,uint8_t value)

{
  bool bVar1;
  Type *this_00;
  char *pcVar2;
  int __c;
  Field *__s;
  
  __s = field;
  bVar1 = IsUnionType(this,field);
  if (bVar1) {
    this_00 = reflection::Field::type(field);
    pcVar2 = reflection::Type::index(this_00,(char *)__s,__c);
    bVar1 = IsValidUnionValue(this,(uint32_t)pcVar2,value);
    return bVar1;
  }
  return false;
}

Assistant:

bool IsValidUnionValue(const reflection::Field *const field,
                         const uint8_t value) {
    return IsUnionType(field) &&
           IsValidUnionValue(field->type()->index(), value);
  }